

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

int conn_init(conn_handle *conn)

{
  undefined4 *puStack_20;
  int ret;
  conn_priv *priv;
  conn_handle *conn_local;
  
  puStack_20 = (undefined4 *)conn->priv;
  if (puStack_20 == (undefined4 *)0x0) {
    puStack_20 = (undefined4 *)calloc(1,0x98);
    if (puStack_20 == (undefined4 *)0x0) {
      return -0xc;
    }
    conn->priv = puStack_20;
  }
  conn_local._4_4_ = mutex_init((mutex_handle *)(puStack_20 + 0x24));
  if (conn_local._4_4_ < 0) {
    free(conn->priv);
    conn->priv = (void *)0x0;
  }
  else {
    *puStack_20 = 0xffffffff;
    puStack_20[1] = 0xffffffff;
    puStack_20[2] = 0xffffffff;
    conn_local._4_4_ = 0;
  }
  return conn_local._4_4_;
}

Assistant:

int conn_init(struct conn_handle *conn)
{
	struct conn_priv *priv = conn->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		conn->priv = priv;
	}

#ifdef _WIN32
	ret = WSAStartup(MAKEWORD(2, 2), &priv->wsadat);
	if (ret != 0) {
		ret = -ret;
		goto conn_init_exit_pre;
	}
#endif

	ret = mutex_init(&priv->mutex);
	if (ret < 0)
		goto conn_init_exit;

	priv->sock_fd = INVALID_SOCKET;
	priv->conn_fd = INVALID_SOCKET;
	priv->fd = INVALID_SOCKET;

	return 0;

conn_init_exit:
#ifdef _WIN32
	WSACleanup();
conn_init_exit_pre:
#endif
	free(conn->priv);
	conn->priv = NULL;

	return ret;
}